

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

void __thiscall fasttext::Meter::writeGeneralMetrics(Meter *this,ostream *out,int32_t k)

{
  _Setprecision _Var1;
  ostream *poVar2;
  void *pvVar3;
  int in_EDX;
  ostream *in_RSI;
  Metrics *in_RDI;
  double dVar4;
  
  poVar2 = std::operator<<(in_RSI,"N");
  poVar2 = std::operator<<(poVar2,"\t");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,in_RDI[1].gold);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  _Var1 = std::setprecision(3);
  std::operator<<(in_RSI,_Var1);
  poVar2 = std::operator<<(in_RSI,"P@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  poVar2 = std::operator<<(poVar2,"\t");
  dVar4 = Metrics::precision(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RSI,"R@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  poVar2 = std::operator<<(poVar2,"\t");
  dVar4 = Metrics::recall(in_RDI);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,dVar4);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Meter::writeGeneralMetrics(std::ostream& out, int32_t k) const {
  out << "N"
      << "\t" << nexamples_ << std::endl;
  out << std::setprecision(3);
  out << "P@" << k << "\t" << metrics_.precision() << std::endl;
  out << "R@" << k << "\t" << metrics_.recall() << std::endl;
}